

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O2

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::Div(ZZ<130UL> *this,word *wRight)

{
  word wVar1;
  word wVar2;
  word wVar3;
  size_t pos;
  long lVar4;
  word rem;
  
  wVar3 = 0;
  for (lVar4 = 2; lVar4 != -1; lVar4 = lVar4 + -1) {
    wVar1 = (this->super_WW<130UL>)._words[lVar4];
    wVar2 = __udivti3(wVar1,wVar3,*wRight,0);
    (this->super_WW<130UL>)._words[lVar4] = wVar2;
    wVar3 = __umodti3(wVar1,wVar3,*wRight);
  }
  *wRight = wVar3;
  return this;
}

Assistant:

ZZ& Div(word& wRight)
	{	
		assert(wRight != 0);
		word rem = 0;
		if (_wcount == 1)
		{
			rem = _words[0] % wRight;
			_words[0] /= wRight;
			wRight = rem;
			return *this;
		}
		dword divisor;
		for (size_t pos = _wcount - 1; pos != SIZE_MAX; --pos)
		{
			// делим (предыдущий_остаток, текущий_разряд) на wRight
			divisor = rem;
			divisor <<= B_PER_W;
			divisor |= _words[pos];
			_words[pos] = word(divisor / wRight);
			rem = word(divisor % wRight);
		}
		wRight = rem;
		return *this;
	}